

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O0

int tbx_readrec(BGZF *fp,void *tbxv,void *sv,int *tid,int *beg,int *end)

{
  undefined1 local_78 [8];
  tbx_intv_t intv;
  int ret;
  kstring_t *s;
  tbx_t *tbx;
  int *end_local;
  int *beg_local;
  int *tid_local;
  void *sv_local;
  void *tbxv_local;
  BGZF *fp_local;
  
  intv._36_4_ = bgzf_getline(fp,10,(kstring_t *)sv);
  if (-1 < (int)intv._36_4_) {
    get_intv((tbx_t *)tbxv,(kstring_t *)sv,(tbx_intv_t *)local_78,0);
    *tid = (int)intv.se;
    *beg = local_78._0_4_;
    *end = (int)intv.beg;
  }
  return intv._36_4_;
}

Assistant:

int tbx_readrec(BGZF *fp, void *tbxv, void *sv, int *tid, int *beg, int *end)
{
    tbx_t *tbx = (tbx_t *) tbxv;
    kstring_t *s = (kstring_t *) sv;
    int ret;
    if ((ret = bgzf_getline(fp, '\n', s)) >= 0) {
        tbx_intv_t intv;
        get_intv(tbx, s, &intv, 0);
        *tid = intv.tid; *beg = intv.beg; *end = intv.end;
    }
    return ret;
}